

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenTypeGet_ObjectAPI_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,Type type,IDLOptions *opts)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_50 [8];
  string new_type_name;
  size_type type_name_length;
  IDLOptions *opts_local;
  CSharpGenerator *this_local;
  string *type_name;
  
  GenTypeGet_abi_cxx11_(__return_storage_ptr__,this,&type);
  switch(type.base_type) {
  case BASE_TYPE_STRUCT:
  case BASE_TYPE_ARRAY:
  case BASE_TYPE_VECTOR:
    if (type.struct_def == (StructDef *)0x0) {
      if (type.element == BASE_TYPE_UNION) {
        NamespacedName_abi_cxx11_(&local_a0,this,&(type.enum_def)->super_Definition);
        std::operator+(&local_80,&local_a0,"Union");
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
      }
    }
    else {
      new_type_name.field_2._8_8_ = std::__cxx11::string::length();
      GenTypeName_ObjectAPI((string *)local_50,this,(string *)type.struct_def,opts);
      lVar1 = std::__cxx11::string::length();
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,lVar1 - new_type_name.field_2._8_8_,
                 (string *)new_type_name.field_2._8_8_);
      std::__cxx11::string::~string((string *)local_50);
    }
    break;
  case BASE_TYPE_UNION:
    NamespacedName_abi_cxx11_(&local_e0,this,&(type.enum_def)->super_Definition);
    std::operator+(&local_c0,&local_e0,"Union");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  if (type.base_type == BASE_TYPE_VECTOR) {
    std::operator+(&local_140,"List<",__return_storage_ptr__);
    std::operator+(&local_120,&local_140,">");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
  }
  else if (type.base_type == BASE_TYPE_ARRAY) {
    std::operator+(&local_100,__return_storage_ptr__,"[]");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeGet_ObjectAPI(flatbuffers::Type type,
                                   const IDLOptions &opts) const {
    auto type_name = GenTypeGet(type);
    // Replace to ObjectBaseAPI Type Name
    switch (type.base_type) {
      case BASE_TYPE_STRUCT: FLATBUFFERS_FALLTHROUGH();  // fall thru
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();   // fall thru
      case BASE_TYPE_VECTOR: {
        if (type.struct_def != nullptr) {
          auto type_name_length = type.struct_def->name.length();
          auto new_type_name =
              GenTypeName_ObjectAPI(type.struct_def->name, opts);
          type_name.replace(type_name.length() - type_name_length,
                            type_name_length, new_type_name);
        } else if (type.element == BASE_TYPE_UNION) {
          type_name = NamespacedName(*type.enum_def) + "Union";
        }
        break;
      }

      case BASE_TYPE_UNION: {
        type_name = NamespacedName(*type.enum_def) + "Union";
        break;
      }
      default: break;
    }

    switch (type.base_type) {
      case BASE_TYPE_ARRAY: {
        type_name = type_name + "[]";
        break;
      }
      case BASE_TYPE_VECTOR: {
        type_name = "List<" + type_name + ">";
        break;
      }
      default: break;
    }
    return type_name;
  }